

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O0

boolean encode_mcu_AC_refine(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  undefined4 uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long *in_RSI;
  long in_RDI;
  int absvalues [64];
  JBLOCKROW block;
  int *natural_order;
  int Al;
  int Se;
  uint BR;
  char *BR_buffer;
  int EOB;
  int k;
  int r;
  int temp;
  huff_entropy_ptr entropy;
  int in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  int in_stack_fffffffffffffea8;
  uint in_stack_fffffffffffffeac;
  huff_entropy_ptr in_stack_fffffffffffffeb0;
  uint local_34;
  long local_30;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  lVar4 = *(long *)(in_RDI + 0x230);
  *(undefined8 *)(lVar4 + 200) = **(undefined8 **)(in_RDI + 0x28);
  *(undefined8 *)(lVar4 + 0xd0) = *(undefined8 *)(*(long *)(in_RDI + 0x28) + 8);
  if ((*(int *)(in_RDI + 0x13c) != 0) && (*(int *)(lVar4 + 0x38) == 0)) {
    emit_restart_e((huff_entropy_ptr)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                   in_stack_fffffffffffffe9c);
  }
  iVar1 = *(int *)(in_RDI + 0x1d0);
  uVar2 = *(undefined4 *)(in_RDI + 0x1d8);
  lVar5 = *(long *)(in_RDI + 0x1e0);
  lVar6 = *in_RSI;
  local_28 = 0;
  for (local_24 = *(int *)(in_RDI + 0x1cc); local_24 <= iVar1; local_24 = local_24 + 1) {
    local_1c = (int)*(short *)(lVar6 + (long)*(int *)(lVar5 + (long)local_24 * 4) * 2);
    if (local_1c < 0) {
      local_1c = -local_1c;
    }
    local_1c = local_1c >> ((byte)uVar2 & 0x1f);
    *(int *)(&stack0xfffffffffffffea8 + (long)local_24 * 4) = local_1c;
    if (local_1c == 1) {
      local_28 = local_24;
    }
  }
  local_20 = 0;
  local_34 = 0;
  local_30 = *(long *)(lVar4 + 0xf0) + (ulong)*(uint *)(lVar4 + 0xe8);
  for (local_24 = *(int *)(in_RDI + 0x1cc); local_24 <= iVar1; local_24 = local_24 + 1) {
    iVar3 = *(int *)(&stack0xfffffffffffffea8 + (long)local_24 * 4);
    if (iVar3 == 0) {
      local_20 = local_20 + 1;
    }
    else {
      while (in_stack_fffffffffffffea7 = 0xf < local_20 && local_24 <= local_28,
            0xf < local_20 && local_24 <= local_28) {
        emit_eobrun((huff_entropy_ptr)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0))
        ;
        emit_ac_symbol((huff_entropy_ptr)
                       CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                       in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98);
        local_20 = local_20 + -0x10;
        emit_buffered_bits((huff_entropy_ptr)
                           CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                           (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),0);
        local_30 = *(long *)(lVar4 + 0xf0);
        local_34 = 0;
      }
      if (iVar3 < 2) {
        emit_eobrun((huff_entropy_ptr)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0))
        ;
        emit_ac_symbol((huff_entropy_ptr)
                       CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                       in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98);
        emit_bits_e(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
        emit_buffered_bits((huff_entropy_ptr)
                           CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                           (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),0);
        local_30 = *(long *)(lVar4 + 0xf0);
        local_34 = 0;
        local_20 = 0;
      }
      else {
        *(byte *)(local_30 + (ulong)local_34) = (byte)iVar3 & 1;
        local_34 = local_34 + 1;
      }
    }
  }
  if ((0 < local_20) || (local_34 != 0)) {
    *(int *)(lVar4 + 0xe4) = *(int *)(lVar4 + 0xe4) + 1;
    *(uint *)(lVar4 + 0xe8) = local_34 + *(int *)(lVar4 + 0xe8);
    if ((*(int *)(lVar4 + 0xe4) == 0x7fff) || (0x3a9 < *(uint *)(lVar4 + 0xe8))) {
      emit_eobrun((huff_entropy_ptr)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
    }
  }
  **(undefined8 **)(in_RDI + 0x28) = *(undefined8 *)(lVar4 + 200);
  *(undefined8 *)(*(long *)(in_RDI + 0x28) + 8) = *(undefined8 *)(lVar4 + 0xd0);
  if (*(int *)(in_RDI + 0x13c) != 0) {
    if (*(int *)(lVar4 + 0x38) == 0) {
      *(undefined4 *)(lVar4 + 0x38) = *(undefined4 *)(in_RDI + 0x13c);
      *(int *)(lVar4 + 0x3c) = *(int *)(lVar4 + 0x3c) + 1;
      *(uint *)(lVar4 + 0x3c) = *(uint *)(lVar4 + 0x3c) & 7;
    }
    *(int *)(lVar4 + 0x38) = *(int *)(lVar4 + 0x38) + -1;
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_AC_refine (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  register int temp;
  register int r, k;
  int EOB;
  char *BR_buffer;
  unsigned int BR;
  int Se, Al;
  const int * natural_order;
  JBLOCKROW block;
  int absvalues[DCTSIZE2];

  entropy->next_output_byte = cinfo->dest->next_output_byte;
  entropy->free_in_buffer = cinfo->dest->free_in_buffer;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval)
    if (entropy->restarts_to_go == 0)
      emit_restart_e(entropy, entropy->next_restart_num);

  Se = cinfo->Se;
  Al = cinfo->Al;
  natural_order = cinfo->natural_order;

  /* Encode the MCU data block */
  block = MCU_data[0];

  /* It is convenient to make a pre-pass to determine the transformed
   * coefficients' absolute values and the EOB position.
   */
  EOB = 0;
  for (k = cinfo->Ss; k <= Se; k++) {
    temp = (*block)[natural_order[k]];
    /* We must apply the point transform by Al.  For AC coefficients this
     * is an integer division with rounding towards 0.  To do this portably
     * in C, we shift after obtaining the absolute value.
     */
    if (temp < 0)
      temp = -temp;		/* temp is abs value of input */
    temp >>= Al;		/* apply the point transform */
    absvalues[k] = temp;	/* save abs value for main pass */
    if (temp == 1)
      EOB = k;			/* EOB = index of last newly-nonzero coef */
  }

  /* Encode the AC coefficients per section G.1.2.3, fig. G.7 */
  
  r = 0;			/* r = run length of zeros */
  BR = 0;			/* BR = count of buffered bits added now */
  BR_buffer = entropy->bit_buffer + entropy->BE; /* Append bits to buffer */

  for (k = cinfo->Ss; k <= Se; k++) {
    if ((temp = absvalues[k]) == 0) {
      r++;
      continue;
    }

    /* Emit any required ZRLs, but not if they can be folded into EOB */
    while (r > 15 && k <= EOB) {
      /* emit any pending EOBRUN and the BE correction bits */
      emit_eobrun(entropy);
      /* Emit ZRL */
      emit_ac_symbol(entropy, entropy->ac_tbl_no, 0xF0);
      r -= 16;
      /* Emit buffered correction bits that must be associated with ZRL */
      emit_buffered_bits(entropy, BR_buffer, BR);
      BR_buffer = entropy->bit_buffer; /* BE bits are gone now */
      BR = 0;
    }

    /* If the coef was previously nonzero, it only needs a correction bit.
     * NOTE: a straight translation of the spec's figure G.7 would suggest
     * that we also need to test r > 15.  But if r > 15, we can only get here
     * if k > EOB, which implies that this coefficient is not 1.
     */
    if (temp > 1) {
      /* The correction bit is the next bit of the absolute value. */
      BR_buffer[BR++] = (char) (temp & 1);
      continue;
    }

    /* Emit any pending EOBRUN and the BE correction bits */
    emit_eobrun(entropy);

    /* Count/emit Huffman symbol for run length / number of bits */
    emit_ac_symbol(entropy, entropy->ac_tbl_no, (r << 4) + 1);

    /* Emit output bit for newly-nonzero coef */
    temp = ((*block)[natural_order[k]] < 0) ? 0 : 1;
    emit_bits_e(entropy, (unsigned int) temp, 1);

    /* Emit buffered correction bits that must be associated with this code */
    emit_buffered_bits(entropy, BR_buffer, BR);
    BR_buffer = entropy->bit_buffer; /* BE bits are gone now */
    BR = 0;
    r = 0;			/* reset zero run length */
  }

  if (r > 0 || BR > 0) {	/* If there are trailing zeroes, */
    entropy->EOBRUN++;		/* count an EOB */
    entropy->BE += BR;		/* concat my correction bits to older ones */
    /* We force out the EOB if we risk either:
     * 1. overflow of the EOB counter;
     * 2. overflow of the correction bit buffer during the next MCU.
     */
    if (entropy->EOBRUN == 0x7FFF || entropy->BE > (MAX_CORR_BITS-DCTSIZE2+1))
      emit_eobrun(entropy);
  }

  cinfo->dest->next_output_byte = entropy->next_output_byte;
  cinfo->dest->free_in_buffer = entropy->free_in_buffer;

  /* Update restart-interval state too */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  return TRUE;
}